

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

Address wasm::anon_unknown_0::getExportedAddress(Module *wasm,Export *export_)

{
  Name name;
  Name *pNVar1;
  Const *pCVar2;
  uint64_t a;
  Const *addrConst;
  char *local_30;
  Global *local_28;
  Global *g;
  Export *export__local;
  Module *wasm_local;
  
  g = (Global *)export_;
  export__local = (Export *)wasm;
  if (export_->kind == Global) {
    pNVar1 = Export::getInternalName(export_);
    addrConst = (Const *)(pNVar1->super_IString).str._M_len;
    local_30 = (pNVar1->super_IString).str._M_str;
  }
  else {
    wasm::Name::Name((Name *)&addrConst);
  }
  name.super_IString.str._M_str = local_30;
  name.super_IString.str._M_len = (size_t)addrConst;
  local_28 = Module::getGlobal(wasm,name);
  pCVar2 = Expression::dynCast<wasm::Const>(local_28->init);
  a = wasm::Literal::getUnsigned(&pCVar2->value);
  wasm::Address::Address((Address *)&wasm_local,a);
  return (Address)(address64_t)wasm_local;
}

Assistant:

static Address getExportedAddress(Module& wasm, Export* export_) {
  Global* g = wasm.getGlobal((export_->kind == ExternalKind::Global)
                               ? *export_->getInternalName()
                               : Name());
  auto* addrConst = g->init->dynCast<Const>();
  return addrConst->value.getUnsigned();
}